

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material_palette.c
# Opt level: O2

bool_t prf_material_palette_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint uVar1;
  bool_t bVar2;
  long lVar3;
  float32_t *pfVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  if (node->opcode == prf_material_palette_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    iVar7 = 4;
    while( true ) {
      uVar1 = (uint)node->length;
      iVar6 = iVar7;
      if ((int)(uint)node->length < iVar7 + 4) break;
      pfVar4 = (float32_t *)(node->data + iVar7);
      bf_put_float32_be(bfile,pfVar4[-1]);
      uVar1 = (uint)node->length;
      iVar6 = iVar7 + 4;
      if ((int)(uint)node->length < iVar7 + 8) break;
      bf_put_float32_be(bfile,*pfVar4);
      uVar1 = (uint)node->length;
      iVar6 = iVar7 + 8;
      if ((int)(uint)node->length < iVar7 + 0xc) break;
      bf_put_float32_be(bfile,pfVar4[1]);
      uVar1 = (uint)node->length;
      iVar6 = iVar7 + 0xc;
      if ((int)(uint)node->length < iVar7 + 0x10) break;
      bf_put_float32_be(bfile,pfVar4[2]);
      uVar1 = (uint)node->length;
      iVar6 = iVar7 + 0x10;
      if ((int)(uint)node->length < iVar7 + 0x14) break;
      bf_put_float32_be(bfile,pfVar4[3]);
      uVar1 = (uint)node->length;
      iVar6 = iVar7 + 0x14;
      if ((int)(uint)node->length < iVar7 + 0x18) break;
      bf_put_float32_be(bfile,pfVar4[4]);
      uVar1 = (uint)node->length;
      iVar6 = iVar7 + 0x18;
      if ((int)(uint)node->length < iVar7 + 0x1c) break;
      bf_put_float32_be(bfile,pfVar4[5]);
      uVar1 = (uint)node->length;
      iVar6 = iVar7 + 0x1c;
      if ((int)(uint)node->length < iVar7 + 0x20) break;
      bf_put_float32_be(bfile,pfVar4[6]);
      uVar1 = (uint)node->length;
      iVar6 = iVar7 + 0x20;
      if ((int)(uint)node->length < iVar7 + 0x24) break;
      bf_put_float32_be(bfile,pfVar4[7]);
      uVar1 = (uint)node->length;
      iVar6 = iVar7 + 0x24;
      if ((int)(uint)node->length < iVar7 + 0x28) break;
      bf_put_float32_be(bfile,pfVar4[8]);
      uVar1 = (uint)node->length;
      iVar6 = iVar7 + 0x28;
      if ((int)(uint)node->length < iVar7 + 0x2c) break;
      bf_put_float32_be(bfile,pfVar4[9]);
      uVar1 = (uint)node->length;
      iVar6 = iVar7 + 0x2c;
      if ((int)(uint)node->length < iVar7 + 0x30) break;
      bf_put_float32_be(bfile,pfVar4[10]);
      uVar1 = (uint)node->length;
      iVar6 = iVar7 + 0x30;
      if ((int)(uint)node->length < iVar7 + 0x34) break;
      bf_put_float32_be(bfile,pfVar4[0xb]);
      uVar1 = (uint)node->length;
      iVar6 = iVar7 + 0x34;
      if ((int)(uint)node->length < iVar7 + 0x38) break;
      bf_put_float32_be(bfile,pfVar4[0xc]);
      uVar1 = (uint)node->length;
      iVar6 = iVar7 + 0x38;
      if ((int)(uint)node->length < iVar7 + 0x3c) break;
      bf_put_uint32_be(bfile,(uint32_t)pfVar4[0xd]);
      uVar1 = (uint)node->length;
      iVar6 = iVar7 + 0x3c;
      if ((int)(uint)node->length < iVar7 + 0x40) break;
      bf_write(bfile,(uint8_t *)(pfVar4 + 0xe),0xc);
      iVar5 = iVar7 + 0xb8;
      lVar3 = 0;
      iVar6 = iVar7 + 0x48;
      while ((iVar7 = iVar5, lVar3 != 0x1c && (iVar7 = iVar6, iVar6 + 4 <= (int)(uint)node->length))
            ) {
        bf_put_uint32_be(bfile,(uint32_t)pfVar4[lVar3 + 0x11]);
        lVar3 = lVar3 + 1;
        iVar6 = iVar6 + 4;
      }
    }
    bVar2 = 1;
    if (uVar1 - iVar6 != 0 && iVar6 <= (int)uVar1) {
      bf_write(bfile,node->data + (long)iVar6 + -4,uVar1 - iVar6);
    }
  }
  else {
    bVar2 = 0;
    prf_error(9,"tried material palette save method on node of type %d.");
  }
  return bVar2;
}

Assistant:

static
bool_t
prf_material_palette_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;
    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_material_palette_info.opcode ) {
        prf_error( 9, "tried material palette save method on node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        int i;
        data = (node_data *) (node->data + pos - 4);
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->ambient_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->ambient_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->ambient_blue ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->diffuse_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->diffuse_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->diffuse_blue ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->specular_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->specular_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->specular_blue ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->emissive_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->emissive_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->emissive_blue ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->shininess ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->alpha ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->flags ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_write( bfile, (uint8_t *) data->name, 12 ); pos += 12;
        for ( i = 0; i < 28 && node->length >= (pos + 4); i++ ) {
            bf_put_uint32_be( bfile, data->reserved1[i] ); pos += 4;
        }
    } while ( TRUE );

    if ( node->length > pos )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}